

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldStatePdu::MinefieldStatePdu(MinefieldStatePdu *this)

{
  MinefieldStatePdu *this_local;
  
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__MinefieldStatePdu_00272908;
  EntityID::EntityID(&this->_minefieldID);
  this->_minefieldSequence = 0;
  this->_forceID = '\0';
  this->_numberOfPerimeterPoints = '\0';
  EntityType::EntityType(&this->_minefieldType);
  this->_numberOfMineTypes = 0;
  Vector3Double::Vector3Double(&this->_minefieldLocation);
  Orientation::Orientation(&this->_minefieldOrientation);
  this->_appearance = 0;
  this->_protocolMode = 0;
  std::vector<DIS::Point,_std::allocator<DIS::Point>_>::vector(&this->_perimeterPoints);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::vector(&this->_mineType);
  Pdu::setPduType((Pdu *)this,'%');
  return;
}

Assistant:

MinefieldStatePdu::MinefieldStatePdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _minefieldSequence(0), 
   _forceID(0), 
   _numberOfPerimeterPoints(0), 
   _minefieldType(), 
   _numberOfMineTypes(0), 
   _minefieldLocation(), 
   _minefieldOrientation(), 
   _appearance(0), 
   _protocolMode(0)
{
    setPduType( 37 );
}